

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O2

void mi_random_init_ex(mi_random_ctx_t *ctx,_Bool use_weak)

{
  _Bool _Var1;
  uint32_t uVar2;
  uintptr_t uVar3;
  undefined7 in_register_00000031;
  size_t i;
  size_t sVar4;
  long lVar5;
  uint8_t *sigma;
  uint8_t key [32];
  
  if ((int)CONCAT71(in_register_00000031,use_weak) == 0) {
    _Var1 = _mi_prim_random_buf(key,0x20);
    if (_Var1) goto LAB_004971e0;
    _mi_warning_message("unable to use secure randomness\n");
  }
  uVar3 = _mi_os_random_weak(0);
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    uVar3 = _mi_random_shuffle(uVar3);
    *(int *)(key + lVar5 * 4) = (int)uVar3;
    uVar3 = uVar3 + 1;
  }
LAB_004971e0:
  memset(ctx,0,0x88);
  for (sVar4 = 0; sVar4 != 4; sVar4 = sVar4 + 1) {
    uVar2 = read32((uint8_t *)"expand 32-byte k",sVar4);
    ctx->input[sVar4] = uVar2;
  }
  for (sVar4 = 0; sVar4 != 8; sVar4 = sVar4 + 1) {
    uVar2 = read32(key,sVar4);
    ctx->input[sVar4 + 4] = uVar2;
  }
  ctx->input[0xc] = 0;
  ctx->input[0xd] = 0;
  *(mi_random_ctx_t **)(ctx->input + 0xe) = ctx;
  return;
}

Assistant:

static void mi_random_init_ex(mi_random_ctx_t* ctx, bool use_weak) {
  uint8_t key[32];
  if (use_weak || !_mi_prim_random_buf(key, sizeof(key))) {
    // if we fail to get random data from the OS, we fall back to a
    // weak random source based on the current time
    #if !defined(__wasi__)
    if (!use_weak) { _mi_warning_message("unable to use secure randomness\n"); }
    #endif
    uintptr_t x = _mi_os_random_weak(0);
    for (size_t i = 0; i < 8; i++, x++) {  // key is eight 32-bit words.
      x = _mi_random_shuffle(x);
      ((uint32_t*)key)[i] = (uint32_t)x;
    }
    ctx->weak = true;
  }
  else {
    ctx->weak = false;
  }
  chacha_init(ctx, key, (uintptr_t)ctx /*nonce*/ );
}